

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.h
# Opt level: O2

void __thiscall S2PointRegion::S2PointRegion(S2PointRegion *this,S2Point *point)

{
  VType VVar1;
  bool bVar2;
  S2LogMessage SStack_18;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2PointRegion_00305af0;
  VVar1 = point->c_[1];
  (this->point_).c_[0] = point->c_[0];
  (this->point_).c_[1] = VVar1;
  (this->point_).c_[2] = point->c_[2];
  bVar2 = S2::IsUnitLength(point);
  if (bVar2) {
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_region.h"
             ,0x49,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: S2::IsUnitLength(point) ");
  abort();
}

Assistant:

inline S2PointRegion::S2PointRegion(const S2Point& point) : point_(point) {
  S2_DCHECK(S2::IsUnitLength(point));
}